

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  nghttp2_stream *stream_00;
  nghttp2_stream *stream;
  int rv;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  if ((frame->hd).stream_id == 0) {
    session_local._4_4_ =
         session_handle_invalid_connection(session,frame,-0x1f9,"RST_STREAM: stream_id == 0");
  }
  else {
    iVar1 = session_detect_idle_stream(session,(frame->hd).stream_id);
    if (iVar1 == 0) {
      stream_00 = nghttp2_session_get_stream(session,(frame->hd).stream_id);
      if (stream_00 != (nghttp2_stream *)0x0) {
        nghttp2_stream_shutdown(stream_00,NGHTTP2_SHUT_RD);
      }
      session_local._4_4_ = session_call_on_frame_received(session,frame);
      if (session_local._4_4_ == 0) {
        session_local._4_4_ =
             nghttp2_session_close_stream
                       (session,(frame->hd).stream_id,(frame->rst_stream).error_code);
        iVar1 = nghttp2_is_fatal(session_local._4_4_);
        if (iVar1 == 0) {
          session_local._4_4_ = 0;
        }
      }
    }
    else {
      session_local._4_4_ =
           session_handle_invalid_connection(session,frame,-0x1f9,"RST_STREAM: stream in idle");
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_rst_stream_received(nghttp2_session *session,
                                           nghttp2_frame *frame) {
  int rv;
  nghttp2_stream *stream;
  if (frame->hd.stream_id == 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream_id == 0");
  }

  if (session_detect_idle_stream(session, frame->hd.stream_id)) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "RST_STREAM: stream in idle");
  }

  stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
  if (stream) {
    /* We may use stream->shut_flags for strict error checking. */
    nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
  }

  rv = session_call_on_frame_received(session, frame);
  if (rv != 0) {
    return rv;
  }
  rv = nghttp2_session_close_stream(session, frame->hd.stream_id,
                                    frame->rst_stream.error_code);
  if (nghttp2_is_fatal(rv)) {
    return rv;
  }
  return 0;
}